

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::listListeners
          (XmlReporter *this,
          vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
          *descriptions)

{
  StringRef text;
  XmlWriter *this_00;
  pointer pLVar1;
  allocator<char> local_79;
  pointer local_78;
  ScopedElement inner;
  string local_60;
  ScopedElement outerTag;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"RegisteredListeners",(allocator<char> *)&inner);
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&outerTag,(string *)this_00,(XmlFormatting)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_78 = (descriptions->
             super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar1 = (descriptions->
                super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                )._M_impl.super__Vector_impl_data._M_start; pLVar1 != local_78; pLVar1 = pLVar1 + 1)
  {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Listener",&local_79);
    XmlWriter::scopedElement((XmlWriter *)&inner,(string *)this_00,(XmlFormatting)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Name",&local_79);
    XmlWriter::startElement(this_00,&local_60,Indent);
    XmlWriter::writeText(this_00,pLVar1->name,None);
    XmlWriter::endElement(this_00,Newline);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Description",&local_79);
    XmlWriter::startElement(this_00,&local_60,Indent);
    text.m_start = (pLVar1->description)._M_dataplus._M_p;
    text.m_size = (pLVar1->description)._M_string_length;
    XmlWriter::writeText(this_00,text,None);
    XmlWriter::endElement(this_00,Newline);
    std::__cxx11::string::~string((string *)&local_60);
    XmlWriter::ScopedElement::~ScopedElement(&inner);
  }
  XmlWriter::ScopedElement::~ScopedElement(&outerTag);
  return;
}

Assistant:

void XmlReporter::listListeners(std::vector<ListenerDescription> const& descriptions) {
        auto outerTag = m_xml.scopedElement( "RegisteredListeners" );
        for ( auto const& listener : descriptions ) {
            auto inner = m_xml.scopedElement( "Listener" );
            m_xml.startElement( "Name", XmlFormatting::Indent )
                .writeText( listener.name, XmlFormatting::None )
                .endElement( XmlFormatting::Newline );
            m_xml.startElement( "Description", XmlFormatting::Indent )
                .writeText( listener.description, XmlFormatting::None )
                .endElement( XmlFormatting::Newline );
        }
    }